

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  LookasideSlot *pLVar1;
  LookasideSlot *pLVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  LookasideSlot *p;
  LookasideSlot *pLVar6;
  bool bVar7;
  
  if ((db->lookaside).nOut == 0) {
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    uVar4 = sz & 0xfffffff8;
    uVar5 = uVar4;
    if ((int)uVar4 < 9) {
      uVar5 = 0;
    }
    iVar3 = cnt;
    if (cnt < 1) {
      iVar3 = 0;
    }
    if (cnt < 1 || (int)uVar4 < 9) {
      pLVar1 = (LookasideSlot *)0x0;
      uVar5 = 0;
    }
    else {
      pLVar1 = (LookasideSlot *)pBuf;
      if (pBuf == (void *)0x0) {
        if (sqlite3Hooks_0 != (code *)0x0) {
          (*sqlite3Hooks_0)();
        }
        pLVar1 = (LookasideSlot *)sqlite3Malloc(uVar5 * iVar3);
        if (sqlite3Hooks_1 != (code *)0x0) {
          (*sqlite3Hooks_1)();
        }
        if (pLVar1 == (LookasideSlot *)0x0) {
          pLVar1 = (LookasideSlot *)0x0;
        }
        else {
          iVar3 = (*sqlite3Config.m.xSize)(pLVar1);
          iVar3 = iVar3 / (int)uVar4;
        }
      }
    }
    (db->lookaside).pStart = pLVar1;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar5;
    if (pLVar1 == (LookasideSlot *)0x0) {
      (db->lookaside).pEnd = (void *)0x0;
      (db->lookaside).bEnabled = '\0';
      bVar7 = false;
    }
    else {
      if (0 < iVar3) {
        iVar3 = iVar3 + 1;
        pLVar2 = (db->lookaside).pFree;
        pLVar6 = pLVar1;
        do {
          pLVar6->pNext = pLVar2;
          pLVar1 = (LookasideSlot *)((long)&pLVar6->pNext + (long)(int)uVar5);
          iVar3 = iVar3 + -1;
          pLVar2 = pLVar6;
          pLVar6 = pLVar1;
        } while (1 < iVar3);
        (db->lookaside).pFree = (LookasideSlot *)((long)pLVar1 - (long)(int)uVar5);
      }
      (db->lookaside).pEnd = pLVar1;
      (db->lookaside).bEnabled = '\x01';
      bVar7 = pBuf == (void *)0x0;
    }
    (db->lookaside).bMalloced = bVar7;
    return 0;
  }
  return 5;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
  void *pStart;
  if( db->lookaside.nOut ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pFree;
      db->lookaside.pFree = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bEnabled = 1;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pEnd = 0;
    db->lookaside.bEnabled = 0;
    db->lookaside.bMalloced = 0;
  }
  return SQLITE_OK;
}